

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void AccessibilityCheckNode(TidyDocImpl *doc,Node *node)

{
  tmbchar *ptVar1;
  Dict *pDVar2;
  ctmbstr path;
  Lexer *pLVar3;
  bool bVar4;
  Bool BVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  AttVal *pAVar10;
  Node *pNVar11;
  uint maxExt;
  ulong uVar12;
  uint uVar13;
  ctmbstr cp;
  char *pcVar14;
  long lVar15;
  tmbchar *ptVar16;
  ctmbstr cp_3;
  bool bVar17;
  tmbstr txt;
  tmbchar local_68 [32];
  tmbchar local_48 [24];
  
  if ((node == (Node *)0x0) || (pDVar2 = node->tag, pDVar2 == (Dict *)0x0)) goto LAB_00132172;
  if (pDVar2->id == TidyTag_BODY) {
    CheckColorContrast(doc,node);
    goto LAB_00132411;
  }
  if (pDVar2 == (Dict *)0x0) {
LAB_00132172:
    BVar5 = prvTidynodeIsHeader(node);
    if (BVar5 == no) {
      if ((node == (Node *)0x0) || (pDVar2 = node->tag, pDVar2 == (Dict *)0x0)) goto LAB_00132411;
      if (pDVar2->id == TidyTag_P) {
        if ((((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) ||
           (pNVar11 = node->content, pNVar11 == (Node *)0x0)) goto LAB_00132411;
        pDVar2 = pNVar11->tag;
        if (pDVar2 != (Dict *)0x0) {
          do {
            if (pNVar11->tag == (Dict *)0x0) goto LAB_00132411;
            pNVar11 = pNVar11->next;
          } while (pNVar11 != (Node *)0x0);
          if ((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_STRONG)) {
            prvTidyReportAccessError(doc,node,0x2b9);
          }
        }
        if (((node->content != (Node *)0x0) && (pDVar2 = node->content->tag, pDVar2 != (Dict *)0x0))
           && (pDVar2->id == TidyTag_U)) {
          prvTidyReportAccessError(doc,node,699);
        }
        if (((node->content == (Node *)0x0) || (pDVar2 = node->content->tag, pDVar2 == (Dict *)0x0))
           || (pDVar2->id != TidyTag_EM)) goto LAB_00132411;
        uVar6 = 0x2ba;
      }
      else {
        if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
        if (pDVar2->id == TidyTag_HTML) {
          if ((doc->access).PRIORITYCHK != 3) goto LAB_00132411;
          pAVar10 = prvTidyAttrGetById(node,TidyAttr_LANG);
          if (pAVar10 == (AttVal *)0x0) {
            uVar6 = 0x2c0;
          }
          else {
            pcVar14 = pAVar10->value;
            if (pcVar14 != (char *)0x0) {
              do {
                if (*pcVar14 == '\0') goto LAB_00132452;
                BVar5 = prvTidyIsWhite((int)*pcVar14);
                pcVar14 = pcVar14 + 1;
              } while (BVar5 != no);
              goto LAB_00132411;
            }
LAB_00132452:
            uVar6 = 0x2c1;
          }
        }
        else {
          if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
          if (pDVar2->id == TidyTag_BLINK) {
            CheckBlink(doc,node);
            goto LAB_00132411;
          }
          if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
          if (pDVar2->id == TidyTag_MARQUEE) {
            CheckMarquee(doc,node);
            goto LAB_00132411;
          }
          if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
          if (pDVar2->id == TidyTag_LINK) {
            CheckLink(doc,node);
            goto LAB_00132411;
          }
          if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
          if (pDVar2->id != TidyTag_STYLE) {
            if (pDVar2 != (Dict *)0x0) {
              if (pDVar2->id == TidyTag_EMBED) {
                CheckEmbed(doc,node);
                ProgrammaticObjects(doc,node);
                AccessibleCompatible(doc,node);
                CheckFlicker(doc,node);
              }
              else if (pDVar2 != (Dict *)0x0) {
                if (pDVar2->id != TidyTag_BASEFONT) {
                  if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                  if (pDVar2->id != TidyTag_CENTER) {
                    if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                    if (pDVar2->id != TidyTag_ISINDEX) {
                      if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                      if (pDVar2->id != TidyTag_U) {
                        if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                        if (pDVar2->id != TidyTag_FONT) {
                          if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                          if (pDVar2->id != TidyTag_DIR) {
                            if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                            if (pDVar2->id != TidyTag_S) {
                              if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                              if (pDVar2->id != TidyTag_STRIKE) {
                                if (pDVar2 == (Dict *)0x0) goto LAB_00132411;
                                if (pDVar2->id != TidyTag_MENU) {
                                  if (pDVar2 != (Dict *)0x0) {
                                    if (pDVar2->id == TidyTag_TH) {
                                      CheckTH(doc,node);
                                    }
                                    else if ((pDVar2 != (Dict *)0x0) &&
                                            ((pDVar2->id == TidyTag_LI ||
                                             ((pDVar2 != (Dict *)0x0 &&
                                              ((pDVar2->id == TidyTag_OL ||
                                               ((pDVar2 != (Dict *)0x0 && (pDVar2->id == TidyTag_UL)
                                                ))))))))) {
                                      CheckListUsage(doc,node);
                                    }
                                  }
                                  goto LAB_00132411;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                CheckDeprecated(doc,node);
              }
            }
            goto LAB_00132411;
          }
          CheckColorContrast(doc,node);
          if ((doc->access).PRIORITYCHK - 4U < 0xfffffffd) goto LAB_00132411;
          uVar6 = 0x2d2;
        }
      }
    }
    else {
      if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto LAB_00132411;
      pNVar11 = node->content;
      bVar17 = true;
      if ((pNVar11 != (Node *)0x0) && (pNVar11->tag == (Dict *)0x0)) {
        ptVar1 = (doc->access).text;
        uVar13 = pNVar11->start;
        if (uVar13 < pNVar11->end) {
          pLVar3 = doc->lexer;
          uVar12 = 0;
          do {
            ptVar1[uVar12] = pLVar3->lexbuf[uVar12 + uVar13];
            if (uVar12 == 0x7f) {
              uVar12 = 0x7f;
              break;
            }
            lVar15 = uVar13 + uVar12;
            uVar12 = uVar12 + 1;
          } while (lVar15 + 1U < (ulong)pNVar11->end);
          uVar12 = uVar12 & 0xffffffff;
        }
        else {
          uVar12 = 0;
        }
        ptVar1[uVar12] = '\0';
        uVar6 = prvTidytmbstrlen(ptVar1);
        if (uVar6 != 0) {
          uVar13 = 1;
          uVar12 = 0;
          do {
            uVar13 = uVar13 + (ptVar1[uVar12] == ' ');
            uVar12 = uVar12 + 1;
            uVar6 = prvTidytmbstrlen(ptVar1);
          } while (uVar12 < uVar6);
          bVar17 = uVar13 < 0x15;
        }
      }
      BVar5 = prvTidynodeIsHeader(node);
      if (BVar5 == no) {
LAB_001323ec:
        prvTidyReportAccessError(doc,node,0x2b8);
      }
      else {
        uVar6 = prvTidynodeHeaderLevel(node);
        pNVar11 = node;
        do {
          pNVar11 = pNVar11->next;
          bVar4 = true;
          if (pNVar11 == (Node *)0x0) break;
          uVar9 = prvTidynodeHeaderLevel(pNVar11);
          bVar4 = uVar9 <= uVar6 + 1;
        } while (uVar9 < uVar6);
        if (!bVar4) goto LAB_001323ec;
      }
      if (bVar17) goto LAB_00132411;
      uVar6 = 700;
    }
  }
  else {
    if (pDVar2->id != TidyTag_HEAD) {
      if (pDVar2 != (Dict *)0x0) {
        if (pDVar2->id == TidyTag_A) {
          pAVar10 = node->attributes;
          if (pAVar10 != (AttVal *)0x0) {
            ptVar1 = (doc->access).text;
            bVar17 = false;
            do {
              if ((((0xfffffffc < (doc->access).PRIORITYCHK - 4U) &&
                   (pAVar10->dict != (Attribute *)0x0)) && (pAVar10->dict->id == TidyAttr_HREF)) &&
                 (pcVar14 = pAVar10->value, pcVar14 != (char *)0x0)) {
                do {
                  if (*pcVar14 == '\0') goto LAB_00131c47;
                  BVar5 = prvTidyIsWhite((int)*pcVar14);
                  pcVar14 = pcVar14 + 1;
                } while (BVar5 != no);
                GetFileExtension(pAVar10->value,local_48,maxExt);
                BVar5 = IsValidMediaExtension(pAVar10->value);
                if (BVar5 != no) {
                  prvTidyReportAccessError(doc,node,0x2ab);
                }
                uVar6 = prvTidytmbstrlen(local_48);
                if ((uVar6 < 6) && (uVar6 = prvTidytmbstrlen(local_48), uVar6 != 0)) {
                  path = pAVar10->value;
                  BVar5 = IsFilePath(path);
                  uVar6 = 0;
                  if (BVar5 != no) {
                    GetFileExtension(path,local_68,0);
                    lVar15 = 0;
                    do {
                      iVar7 = prvTidytmbstrcasecmp
                                        (local_68,(ctmbstr)((long)&soundExtensions_rel +
                                                           (long)*(int *)((long)&soundExtensions_rel
                                                                         + lVar15)));
                      if (iVar7 == 0) {
                        uVar6 = *(uint *)((long)soundExtErrCodes + lVar15);
                        goto LAB_00131ccc;
                      }
                      lVar15 = lVar15 + 4;
                    } while (lVar15 != 0x18);
                    uVar6 = 0;
                  }
LAB_00131ccc:
                  if (uVar6 != 0) {
                    pNVar11 = node->next;
                    if ((pNVar11 != (Node *)0x0) && (pNVar11->tag == (Dict *)0x0)) {
                      uVar13 = pNVar11->start;
                      if (uVar13 < pNVar11->end) {
                        pLVar3 = doc->lexer;
                        uVar12 = 0;
                        do {
                          ptVar1[uVar12] = pLVar3->lexbuf[uVar12 + uVar13];
                          if (uVar12 == 0x7f) {
                            uVar12 = 0x7f;
                            break;
                          }
                          lVar15 = uVar13 + uVar12;
                          uVar12 = uVar12 + 1;
                        } while (lVar15 + 1U < (ulong)pNVar11->end);
                        uVar12 = uVar12 & 0xffffffff;
                      }
                      else {
                        uVar12 = 0;
                      }
                      ptVar1[uVar12] = '\0';
                      ptVar16 = ptVar1;
                      do {
                        if (*ptVar16 == '\0') goto LAB_00131d71;
                        BVar5 = prvTidyIsWhite((int)*ptVar16);
                        ptVar16 = ptVar16 + 1;
                      } while (BVar5 != no);
                      bVar17 = true;
                    }
LAB_00131d71:
                    bVar4 = !bVar17;
                    bVar17 = true;
                    if (bVar4) {
                      prvTidyReportAccessError(doc,node,uVar6);
                      bVar17 = false;
                    }
                  }
                }
              }
LAB_00131c47:
              if (((((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) &&
                  (pAVar10->dict != (Attribute *)0x0)) && (pAVar10->dict->id == TidyAttr_TARGET)) {
                if ((pAVar10->value == (ctmbstr)0x0) ||
                   (iVar7 = prvTidytmbstrcasecmp(pAVar10->value,"_new"), iVar7 != 0)) {
                  if ((pAVar10->value == (ctmbstr)0x0) ||
                     (iVar7 = prvTidytmbstrcasecmp(pAVar10->value,"_blank"), iVar7 != 0))
                  goto LAB_00131caf;
                  uVar6 = 0x2f4;
                }
                else {
                  uVar6 = 0x2f3;
                }
                prvTidyReportAccessError(doc,node,uVar6);
              }
LAB_00131caf:
              pAVar10 = pAVar10->next;
            } while (pAVar10 != (AttVal *)0x0);
          }
          if (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2) goto LAB_00132411;
          pNVar11 = node->content;
          if ((pNVar11 != (Node *)0x0) && (pNVar11->tag == (Dict *)0x0)) {
            ptVar1 = (doc->access).text;
            uVar13 = pNVar11->start;
            if (uVar13 < pNVar11->end) {
              pLVar3 = doc->lexer;
              uVar12 = 0;
              do {
                ptVar1[uVar12] = pLVar3->lexbuf[uVar12 + uVar13];
                if (uVar12 == 0x7f) {
                  uVar12 = 0x7f;
                  break;
                }
                lVar15 = uVar13 + uVar12;
                uVar12 = uVar12 + 1;
              } while (lVar15 + 1U < (ulong)pNVar11->end);
              uVar12 = uVar12 & 0xffffffff;
            }
            else {
              uVar12 = 0;
            }
            ptVar1[uVar12] = '\0';
            ptVar16 = ptVar1;
            do {
              if (*ptVar16 == '\0') goto LAB_00131df6;
              BVar5 = prvTidyIsWhite((int)*ptVar16);
              ptVar16 = ptVar16 + 1;
            } while (BVar5 != no);
            iVar7 = prvTidytmbstrcmp(ptVar1,"more");
            iVar8 = prvTidytmbstrcmp(ptVar1,"click here");
            if (iVar8 == 0) {
              prvTidyReportAccessError(doc,node,0x308);
            }
            if ((iVar7 != 0) && (uVar6 = prvTidytmbstrlen(ptVar1), uVar6 < 6)) {
              prvTidyReportAccessError(doc,node,0x305);
            }
            uVar6 = prvTidytmbstrlen(ptVar1);
            if (0x3c < uVar6) {
              prvTidyReportAccessError(doc,node,0x307);
            }
          }
LAB_00131df6:
          if (node->content != (Node *)0x0) goto LAB_00132411;
          uVar6 = 0x306;
          goto LAB_0013240c;
        }
        if (pDVar2 != (Dict *)0x0) {
          if (pDVar2->id == TidyTag_IMG) {
            CheckFlicker(doc,node);
            CheckColorAvailable(doc,node);
            CheckImage(doc,node);
            goto LAB_00132411;
          }
          if (pDVar2 != (Dict *)0x0) {
            if (pDVar2->id == TidyTag_MAP) {
              CheckMapLinks(doc,node);
              goto LAB_00132411;
            }
            if (pDVar2 != (Dict *)0x0) {
              if (pDVar2->id == TidyTag_AREA) {
                CheckArea(doc,node);
                goto LAB_00132411;
              }
              if (pDVar2 != (Dict *)0x0) {
                if (pDVar2->id == TidyTag_APPLET) {
                  CheckDeprecated(doc,node);
                  ProgrammaticObjects(doc,node);
                  DynamicContent(doc,node);
                  AccessibleCompatible(doc,node);
                  CheckFlicker(doc,node);
                  CheckColorAvailable(doc,node);
                  CheckApplet(doc,node);
                  goto LAB_00132411;
                }
                if (pDVar2 != (Dict *)0x0) {
                  if (pDVar2->id == TidyTag_OBJECT) {
                    ProgrammaticObjects(doc,node);
                    DynamicContent(doc,node);
                    AccessibleCompatible(doc,node);
                    CheckFlicker(doc,node);
                    CheckColorAvailable(doc,node);
                    CheckObject(doc,node);
                    goto LAB_00132411;
                  }
                  if (pDVar2 != (Dict *)0x0) {
                    if (pDVar2->id == TidyTag_FRAME) {
                      CheckFrame(doc,node);
                      goto LAB_00132411;
                    }
                    if (pDVar2 != (Dict *)0x0) {
                      if (pDVar2->id == TidyTag_IFRAME) {
                        CheckIFrame(doc,node);
                        goto LAB_00132411;
                      }
                      if (pDVar2 != (Dict *)0x0) {
                        if (pDVar2->id == TidyTag_SCRIPT) {
                          DynamicContent(doc,node);
                          ProgrammaticObjects(doc,node);
                          AccessibleCompatible(doc,node);
                          CheckFlicker(doc,node);
                          CheckColorAvailable(doc,node);
                          CheckScriptAcc(doc,node);
                          goto LAB_00132411;
                        }
                        if (pDVar2 != (Dict *)0x0) {
                          if (pDVar2->id == TidyTag_TABLE) {
                            CheckColorContrast(doc,node);
                            CheckTable(doc,node);
                            goto LAB_00132411;
                          }
                          if (pDVar2 != (Dict *)0x0) {
                            if (pDVar2->id == TidyTag_PRE) {
LAB_001320ec:
                              CheckASCII(doc,node);
                              goto LAB_00132411;
                            }
                            if (pDVar2 != (Dict *)0x0) {
                              if (pDVar2->id == TidyTag_XMP) goto LAB_001320ec;
                              if (pDVar2 != (Dict *)0x0) {
                                if (pDVar2->id == TidyTag_LABEL) {
                                  CheckLabel(doc,node);
                                  goto LAB_00132411;
                                }
                                if (pDVar2 != (Dict *)0x0) {
                                  if (pDVar2->id == TidyTag_INPUT) {
                                    CheckColorAvailable(doc,node);
                                    CheckInputLabel(doc,node);
                                    CheckInputAttributes(doc,node);
                                    goto LAB_00132411;
                                  }
                                  if ((pDVar2 != (Dict *)0x0) && (pDVar2->id == TidyTag_FRAMESET)) {
                                    CheckFrameSet(doc,node);
                                    goto LAB_00132411;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      goto LAB_00132172;
    }
    BVar5 = CheckMetaData(doc,node,no);
    if ((BVar5 != no) || (((doc->access).PRIORITYCHK & 0xfffffffeU) != 2)) goto LAB_00132411;
    uVar6 = 0x309;
  }
LAB_0013240c:
  prvTidyReportAccessError(doc,node,uVar6);
LAB_00132411:
  for (pNVar11 = node->content; pNVar11 != (Node *)0x0; pNVar11 = pNVar11->next) {
    AccessibilityCheckNode(doc,pNVar11);
  }
  return;
}

Assistant:

static void AccessibilityCheckNode( TidyDocImpl* doc, Node* node )
{
    Node* content;
    
    /* Check BODY for color contrast */
    if ( nodeIsBODY(node) )
    {
        CheckColorContrast( doc, node );
    }

    /* Checks document for MetaData */
    else if ( nodeIsHEAD(node) )
    {
        if ( !CheckMetaData( doc, node, no ) )
          MetaDataPresent( doc, node );
    }
    
    /* Check the ANCHOR tag */
    else if ( nodeIsA(node) )
    {
        CheckAnchorAccess( doc, node );
    }

    /* Check the IMAGE tag */
    else if ( nodeIsIMG(node) )
    {
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckImage( doc, node );
    }

        /* Checks MAP for client-side text links */
    else if ( nodeIsMAP(node) )
    {
        CheckMapLinks( doc, node );
    }

    /* Check the AREA tag */
    else if ( nodeIsAREA(node) )
    {
        CheckArea( doc, node );
    }

    /* Check the APPLET tag */
    else if ( nodeIsAPPLET(node) )
    {
        CheckDeprecated( doc, node );
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckApplet(doc, node );
    }
    
    /* Check the OBJECT tag */
    else if ( nodeIsOBJECT(node) )
    {
        ProgrammaticObjects( doc, node );
        DynamicContent( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckObject( doc, node );
    }
    
    /* Check the FRAME tag */
    else if ( nodeIsFRAME(node) )
    {
        CheckFrame( doc, node );
    }
    
    /* Check the IFRAME tag */
    else if ( nodeIsIFRAME(node) )
    {
        CheckIFrame( doc, node );
    }
    
    /* Check the SCRIPT tag */
    else if ( nodeIsSCRIPT(node) )
    {
        DynamicContent( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
        CheckColorAvailable( doc, node );
        CheckScriptAcc( doc, node );
    }

    /* Check the TABLE tag */
    else if ( nodeIsTABLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckTable( doc, node );
    }

    /* Check the PRE for ASCII art */
    else if ( nodeIsPRE(node) || nodeIsXMP(node) )
    {
        CheckASCII( doc, node );
    }

    /* Check the LABEL tag */
    else if ( nodeIsLABEL(node) )
    {
        CheckLabel( doc, node );
    }

    /* Check INPUT tag for validity */
    else if ( nodeIsINPUT(node) )
    {
        CheckColorAvailable( doc, node );
        CheckInputLabel( doc, node );
        CheckInputAttributes( doc, node );
    }

    /* Checks FRAMESET element for NOFRAME section */
    else if ( nodeIsFRAMESET(node) )
    {
        CheckFrameSet( doc, node );
    }
    
    /* Checks for header elements for valid header increase */
    else if ( TY_(nodeIsHeader)(node) )
    {
        CheckHeaderNesting( doc, node );
    }

    /* Checks P element to ensure that it is not a header */
    else if ( nodeIsP(node) )
    {
        CheckParagraphHeader( doc, node );
    }

    /* Checks HTML element for valid 'LANG' */
    else if ( nodeIsHTML(node) )
    {
        CheckHTMLAccess( doc, node );
    }

    /* Checks BLINK for any blinking text */
    else if ( nodeIsBLINK(node) )
    {
        CheckBlink( doc, node );
    }

    /* Checks MARQUEE for any MARQUEE text */
    else if ( nodeIsMARQUEE(node) )
    {
        CheckMarquee( doc, node );
    }

    /* Checks LINK for 'REL' attribute */
    else if ( nodeIsLINK(node) )
    {
        CheckLink( doc, node );
    }

    /* Checks to see if STYLE is used */
    else if ( nodeIsSTYLE(node) )
    {
        CheckColorContrast( doc, node );
        CheckStyle( doc, node );
    }

    /* Checks to see if EMBED is used */
    else if ( nodeIsEMBED(node) )
    {
        CheckEmbed( doc, node );
        ProgrammaticObjects( doc, node );
        AccessibleCompatible( doc, node );
        CheckFlicker( doc, node );
    }

    /* Deprecated HTML if the following tags are found in the document */
    else if ( nodeIsBASEFONT(node) ||
              nodeIsCENTER(node)   ||
              nodeIsISINDEX(node)  ||
              nodeIsU(node)        ||
              nodeIsFONT(node)     ||
              nodeIsDIR(node)      ||
              nodeIsS(node)        ||
              nodeIsSTRIKE(node)   ||
              nodeIsMENU(node) )
    {
        CheckDeprecated( doc, node );
    }

    /* Checks for 'ABBR' attribute if needed */
    else if ( nodeIsTH(node) )
    {
        CheckTH( doc, node );
    }

    /* Ensures that lists are properly used */
    else if ( nodeIsLI(node) || nodeIsOL(node) || nodeIsUL(node) )
    {
        CheckListUsage( doc, node );
    }

    /* Recursively check all child nodes.
    */
    for ( content = node->content; content != NULL; content = content->next )
    {
        AccessibilityCheckNode( doc, content );
    }
}